

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>>
::
AdapterPromiseNode<kj::_::WeakFulfiller<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>&>
          (AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>>
           *this,WeakFulfiller<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>
                 *params)

{
  WeakFulfiller<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> *wrapper;
  WeakFulfiller<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> *params_local;
  AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,_kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>_>
  *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::
  PromiseFulfiller((PromiseFulfiller<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>
                    *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_00cd3a88;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_00cd3ad0;
  ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::ExceptionOr
            ((ExceptionOr<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo> *)
             (this + 0x18));
  this[400] = (AdapterPromiseNode<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo,kj::_::PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>>
               )0x1;
  wrapper = fwd<kj::_::WeakFulfiller<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>&>
                      (params);
  PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>::
  PromiseAndFulfillerAdapter
            ((PromiseAndFulfillerAdapter<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>
              *)(this + 0x198),
             (PromiseFulfiller<capnp::_::(anonymous_namespace)::RpcConnectionState::DisconnectInfo>
              *)(this + 0x10),wrapper);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}